

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void realpath_cb(uv_fs_t *req)

{
  int iVar1;
  size_t sVar2;
  undefined8 uVar3;
  char *pcVar4;
  size_t test_file_abs_size;
  char test_file_abs_buf [4096];
  size_t local_1020;
  char local_1018 [7];
  undefined4 auStack_1011 [1024];
  
  local_1020 = 0x1000;
  if (req->fs_type == UV_FS_REALPATH) {
    if (req->result == 0) {
      uv_cwd(local_1018,&local_1020);
      sVar2 = strlen(local_1018);
      builtin_strncpy(local_1018 + sVar2,"/test_fi",8);
      *(undefined4 *)((long)auStack_1011 + sVar2) = 0x656c69;
      iVar1 = strcmp((char *)req->ptr,local_1018);
      if (iVar1 == 0) {
        realpath_cb_count = realpath_cb_count + 1;
        uv_fs_req_cleanup(req);
        return;
      }
      pcVar4 = "strcmp(req->ptr, test_file_abs_buf) == 0";
      uVar3 = 0xf0;
    }
    else {
      pcVar4 = "req->result == 0";
      uVar3 = 0xe8;
    }
  }
  else {
    pcVar4 = "req->fs_type == UV_FS_REALPATH";
    uVar3 = 0xdd;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs.c",
          uVar3,pcVar4);
  abort();
}

Assistant:

static void realpath_cb(uv_fs_t* req) {
  char test_file_abs_buf[PATHMAX];
  size_t test_file_abs_size = sizeof(test_file_abs_buf);
  ASSERT(req->fs_type == UV_FS_REALPATH);
#ifdef _WIN32
  /*
   * Windows XP and Server 2003 don't support GetFinalPathNameByHandleW()
   */
  if (req->result == UV_ENOSYS) {
    realpath_cb_count++;
    uv_fs_req_cleanup(req);
    return;
  }
#endif
  ASSERT(req->result == 0);

  uv_cwd(test_file_abs_buf, &test_file_abs_size);
#ifdef _WIN32
  strcat(test_file_abs_buf, "\\test_file");
  ASSERT(stricmp(req->ptr, test_file_abs_buf) == 0);
#else
  strcat(test_file_abs_buf, "/test_file");
  ASSERT(strcmp(req->ptr, test_file_abs_buf) == 0);
#endif
  realpath_cb_count++;
  uv_fs_req_cleanup(req);
}